

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O1

int luaB_costatus(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  size_t len;
  char *s;
  lua_Debug ar;
  lua_Debug local_90;
  
  L_00 = lua_tothread(L,1);
  if (L_00 == (lua_State *)0x0) {
    luaL_argerror(L,1,"coroutine expected");
  }
  if (L_00 == L) {
    s = "running";
    len = 7;
    goto LAB_00115ede;
  }
  iVar1 = lua_status(L_00);
  if (iVar1 == 0) {
    iVar1 = lua_getstack(L_00,0,&local_90);
    if (0 < iVar1) {
      s = "normal";
      len = 6;
      goto LAB_00115ede;
    }
    iVar1 = lua_gettop(L_00);
    if (iVar1 != 0) goto LAB_00115ed2;
  }
  else if (iVar1 == 1) {
LAB_00115ed2:
    s = "suspended";
    len = 9;
    goto LAB_00115ede;
  }
  s = "dead";
  len = 4;
LAB_00115ede:
  lua_pushlstring(L,s,len);
  return 1;
}

Assistant:

static int luaB_costatus (lua_State *L) {
  lua_State *co = lua_tothread(L, 1);
  luaL_argcheck(L, co, 1, "coroutine expected");
  if (L == co) lua_pushliteral(L, "running");
  else {
    switch (lua_status(co)) {
      case LUA_YIELD:
        lua_pushliteral(L, "suspended");
        break;
      case LUA_OK: {
        lua_Debug ar;
        if (lua_getstack(co, 0, &ar) > 0)  /* does it have frames? */
          lua_pushliteral(L, "normal");  /* it is running */
        else if (lua_gettop(co) == 0)
            lua_pushliteral(L, "dead");
        else
          lua_pushliteral(L, "suspended");  /* initial state */
        break;
      }
      default:  /* some error occurred */
        lua_pushliteral(L, "dead");
        break;
    }
  }
  return 1;
}